

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicValue::Pipeline::~Pipeline(Pipeline *this)

{
  Type TVar1;
  Type local_1c;
  Fault local_18;
  Fault f;
  Pipeline *this_local;
  
  TVar1 = this->type;
  if (TVar1 != UNKNOWN) {
    f.exception = (Exception *)this;
    if (TVar1 == STRUCT) {
      kj::dtor<capnp::DynamicStruct::Pipeline>(&(this->field_1).structValue);
    }
    else if (TVar1 == CAPABILITY) {
      kj::dtor<capnp::DynamicCapability::Client>(&(this->field_1).capabilityValue);
    }
    else {
      local_1c = this->type;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int>
                (&local_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x692,FAILED,(char *)0x0,"\"Unexpected pipeline type.\", (uint)type",
                 (char (*) [26])"Unexpected pipeline type.",&local_1c);
      this->type = UNKNOWN;
      kj::_::Debug::Fault::~Fault(&local_18);
    }
  }
  return;
}

Assistant:

DynamicValue::Pipeline::~Pipeline() noexcept(false) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::dtor(structValue); break;
    case CAPABILITY: kj::dtor(capabilityValue); break;
    default:
      KJ_FAIL_ASSERT("Unexpected pipeline type.", (uint)type) { type = UNKNOWN; break; }
      break;
  }
}